

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test7::executeFunctionalTest(GPUShaderFP64Test7 *this,_variables *variables)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  reference pvVar8;
  _variable_type type;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  MessageBuilder local_520;
  string local_3a0;
  MessageBuilder local_380;
  unsigned_long local_200;
  size_t n_variable;
  size_t n_variables;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0 [4];
  MessageBuilder local_1d0;
  byte *local_50;
  uchar *pixel_ptr;
  uchar *puStack_40;
  uint x;
  uchar *row_ptr;
  uint y;
  float epsilon;
  Functions *gl;
  _variables *p_Stack_20;
  bool result;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  gl._7_1_ = 1;
  p_Stack_20 = variables;
  variables_local = (_variables *)this;
  bVar1 = buildTestProgram(this,variables);
  if (bVar1) {
    if ((this->m_are_double_inputs_supported & 1U) != 0) {
      setInputAttributeValues(this,p_Stack_20);
    }
    configureXFBBuffer(this,p_Stack_20);
    pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar3 = (*pRVar5->_vptr_RenderContext[3])();
    _y = CONCAT44(extraout_var,iVar3);
    (**(code **)(_y + 0x1c0))(0x3f800000,0x3f800000,0x3f800000);
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glClearColor() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23df);
    (**(code **)(_y + 0x188))(0x4000);
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glClear() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e2);
    (**(code **)(_y + 0x1680))(this->m_po_id);
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e5);
    (**(code **)(_y + 0x1a00))(0,0,this->m_to_width,this->m_to_height);
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ea);
    (**(code **)(_y + 0x30))(4);
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ed);
    (**(code **)(_y + 0x538))(0xe,0,4);
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f0);
    (**(code **)(_y + 0x638))();
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f3);
    row_ptr._4_4_ = 0x3b808081;
    (**(code **)(_y + 0x1220))(0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data)
    ;
    dVar4 = (**(code **)(_y + 0x800))();
    glu::checkError(dVar4,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f9);
    for (row_ptr._0_4_ = 0; (uint)row_ptr < this->m_to_height; row_ptr._0_4_ = (uint)row_ptr + 1) {
      puStack_40 = this->m_to_data + this->m_to_width * 4 * (uint)row_ptr;
      pixel_ptr._4_4_ = 0;
LAB_00fa5026:
      if (pixel_ptr._4_4_ < this->m_to_width) {
        local_50 = puStack_40 + (pixel_ptr._4_4_ << 2);
        bVar2 = de::abs<unsigned_char>(*local_50);
        if (((((float)bVar2 <= 0.003921569) &&
             (iVar3 = de::abs<int>(local_50[1] - 0xff), (float)iVar3 <= 0.003921569)) &&
            (bVar2 = de::abs<unsigned_char>(local_50[2]), (float)bVar2 <= 0.003921569)) &&
           (bVar2 = de::abs<unsigned_char>(local_50[3]), (float)bVar2 <= 0.003921569))
        goto LAB_00fa56f8;
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1d0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_1d0,(char (*) [25])"Invalid pixel found at (");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&pixel_ptr + 4));
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&row_ptr);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [37])"); expected:(0, 255, 0, 0), found: (");
        local_1e0[0] = (uint)*local_50;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)local_1e0);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        local_1e4 = (uint)local_50[1];
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_1e4);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        local_1e8 = (uint)local_50[2];
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_1e8);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        n_variables._4_4_ = (uint)local_50[3];
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&n_variables + 4));
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [55])
                                   "), with the following variable types used as varyings:");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d0);
        n_variable = std::
                     vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                     ::size(p_Stack_20);
        for (local_200 = 0; local_200 < n_variable; local_200 = local_200 + 1) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_380,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_380,(char (*) [12])0x29f50be);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_200);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a0a8b4);
          pvVar8 = std::
                   vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   ::operator[](p_Stack_20,local_200);
          Utils::getVariableTypeString_abi_cxx11_(&local_3a0,(Utils *)(ulong)pvVar8->type,type);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3a0);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])" (array size:");
          pvVar8 = std::
                   vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   ::operator[](p_Stack_20,local_200);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pvVar8->array_size);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a85ff4);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_3a0);
          tcu::MessageBuilder::~MessageBuilder(&local_380);
        }
        logVariableContents(this,p_Stack_20);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_520,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_520,(char (*) [22])"Shaders used:\n\n(VS):\n");
        local_528 = (char *)std::__cxx11::string::c_str();
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_528);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])"(TC):\n\n");
        local_530 = (char *)std::__cxx11::string::c_str();
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_530);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])"\n(TE):\n\n");
        local_538 = (char *)std::__cxx11::string::c_str();
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_538);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])"\n(GS):\n");
        local_540 = (char *)std::__cxx11::string::c_str();
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_540);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])"\n(FS):\n\n");
        local_548 = (char *)std::__cxx11::string::c_str();
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_548);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_520);
        gl._7_1_ = 0;
        break;
      }
    }
    this_local._7_1_ = (bool)(gl._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
LAB_00fa56f8:
  pixel_ptr._4_4_ = pixel_ptr._4_4_ + 1;
  goto LAB_00fa5026;
}

Assistant:

bool GPUShaderFP64Test7::executeFunctionalTest(_variables& variables)
{
	bool result = true;

	/* Build the test program */
	if (!buildTestProgram(variables))
	{
		return false;
	}

	/* Set up input attributes if GL_ARB_vertex_attrib_64bit extension is supported */
	if (m_are_double_inputs_supported)
	{
		setInputAttributeValues(variables);
	}

	/* Set up buffer object to hold XFB data. The data will be used for logging purposes
	 * only, if a data mismatch is detected.
	 */
	configureXFBBuffer(variables);

	/* Issue a draw call using the test program */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.viewport(0, /* x */
				0, /* y */
				m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_PATCHES, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Verify color attachment contents */
	const float epsilon = 1.0f / 255.0f;

	gl.readPixels(0 /* x */, 0 /* y */, m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		const unsigned char* row_ptr = m_to_data + 4 /* rgba */ * m_to_width * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			const unsigned char* pixel_ptr = row_ptr + 4 /* rgba */ * x;

			if (de::abs(pixel_ptr[0]) > epsilon || de::abs(pixel_ptr[1] - 255) > epsilon ||
				de::abs(pixel_ptr[2]) > epsilon || de::abs(pixel_ptr[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel found at (" << x << ", " << y
								   << ")"
									  "; expected:(0, 255, 0, 0), found: ("
								   << (int)pixel_ptr[0] << ", " << (int)pixel_ptr[1] << ", " << (int)pixel_ptr[2]
								   << ", " << (int)pixel_ptr[3]
								   << "), with the following variable types used as varyings:"
								   << tcu::TestLog::EndMessage;

				/* List the variable types that failed the test */
				const size_t n_variables = variables.size();

				for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "gs_variable" << n_variable << ": "
									   << Utils::getVariableTypeString(variables[n_variable].type)
									   << " (array size:" << variables[n_variable].array_size << ")"
									   << tcu::TestLog::EndMessage;
				} /* for (all variable types) */

				/* Log the variable contents */
				logVariableContents(variables);

				/* Log shaders used for the iteration */
				m_testCtx.getLog() << tcu::TestLog::Message << "Shaders used:\n"
															   "\n"
															   "(VS):\n"
								   << m_current_vs_body.c_str() << "\n"
								   << "(TC):\n"
									  "\n"
								   << m_current_tc_body.c_str() << "\n"
																   "(TE):\n"
																   "\n"
								   << m_current_te_body.c_str() << "\n"
																   "(GS):\n"
								   << m_current_gs_body.c_str() << "\n"
																   "(FS):\n"
																   "\n"
								   << m_current_fs_body.c_str() << tcu::TestLog::EndMessage;

				result = false;

				goto end;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */

/* All done! */
end:
	return result;
}